

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# POSIXEnvironment.h
# Opt level: O2

void __thiscall
llbuild::basic::POSIXEnvironment::setIfMissing(POSIXEnvironment *this,StringRef key,StringRef value)

{
  __ireturn_type _Var1;
  StringRef key_local;
  StringRef local_140;
  SmallString<256U> assignment;
  
  key_local.Length = key.Length;
  key_local.Data = key.Data;
  if (this->isFrozen != true) {
    _Var1 = std::__detail::
            _Insert_base<llvm::StringRef,_llvm::StringRef,_std::allocator<llvm::StringRef>,_std::__detail::_Identity,_std::equal_to<llvm::StringRef>,_std::hash<llvm::StringRef>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::insert((_Insert_base<llvm::StringRef,_llvm::StringRef,_std::allocator<llvm::StringRef>,_std::__detail::_Identity,_std::equal_to<llvm::StringRef>,_std::hash<llvm::StringRef>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      *)&this->keys,&key_local);
    if (((undefined1  [16])_Var1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      assignment.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
      super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.BeginX =
           &assignment.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>;
      assignment.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
      super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.Size = 0;
      assignment.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
      super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.Capacity = 0x100;
      llvm::SmallVectorImpl<char>::append<char_const*,void>
                ((SmallVectorImpl<char> *)&assignment,key_local.Data,
                 key_local.Data + key_local.Length);
      llvm::SmallString<256U>::operator+=(&assignment,'=');
      llvm::SmallVectorImpl<char>::append<char_const*,void>
                ((SmallVectorImpl<char> *)&assignment,value.Data,value.Data + value.Length);
      llvm::SmallString<256U>::operator+=(&assignment,'\0');
      local_140.Length =
           assignment.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
           super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
           super_SmallVectorBase._8_8_ & 0xffffffff;
      local_140.Data =
           (char *)assignment.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                   super_SmallVectorTemplateBase<char,_true>.
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<llvm::StringRef>(&this->envStorage,&local_140);
      llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&assignment);
    }
    return;
  }
  __assert_fail("!isFrozen",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/Basic/POSIXEnvironment.h"
                ,0x43,"void llbuild::basic::POSIXEnvironment::setIfMissing(StringRef, StringRef)");
}

Assistant:

void setIfMissing(StringRef key, StringRef value) {
    assert(!isFrozen);
    if (keys.insert(key).second) {
      llvm::SmallString<256> assignment;
      assignment += key;
      assignment += '=';
      assignment += value;
      assignment += '\0';
      envStorage.emplace_back(assignment.str());
    }
  }